

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O2

void InitAutomate(char *autotab,uchar *def)

{
  memset(autotab,0,0x100);
  for (; (ulong)*def != 0; def = def + 1) {
    autotab[*def] = '\x01';
  }
  return;
}

Assistant:

void InitAutomate(char *autotab, const unsigned char *def)
{
	#undef FUNC
	#define FUNC "InitAutomate"

	int i;

	memset(autotab,0,256);
	for (i=0;def[i];i++) {
		autotab[(int)def[i]]=1;
	}
}